

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O2

void __thiscall
de::ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer
          (ArrayBuffer<int,_4UL,_4UL> *this,ArrayBuffer<int,_4UL,_4UL> *other)

{
  size_t sVar1;
  void *pvVar2;
  ArrayBuffer<int,_4UL,_4UL> tmp;
  ArrayBuffer<int,_4UL,_4UL> local_30;
  
  this->m_ptr = (void *)0x0;
  this->m_cap = 0;
  sVar1 = other->m_cap;
  if (sVar1 != 0) {
    ArrayBuffer(&local_30,sVar1);
    memcpy(local_30.m_ptr,other->m_ptr,(long)((int)sVar1 << 2));
    pvVar2 = this->m_ptr;
    sVar1 = this->m_cap;
    this->m_ptr = local_30.m_ptr;
    this->m_cap = local_30.m_cap;
    local_30.m_ptr = pvVar2;
    local_30.m_cap = sVar1;
    clear(&local_30);
  }
  return;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>::ArrayBuffer (const ArrayBuffer<T,Alignment,Stride>& other)
	: m_ptr	(DE_NULL)
	, m_cap	(0)
{
	if (other.m_cap)
	{
		// copy to temporary and swap to it

		const size_t	storageSize =	(other.m_cap - 1) * Stride + sizeof(T);
		ArrayBuffer		tmp				(other.m_cap);

		deMemcpy(tmp.m_ptr, other.m_ptr, (int)storageSize);
		swap(tmp);
	}
}